

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<int>::RepeatedField
          (RepeatedField<int> *this,Arena *arena,RepeatedField<int> *rhs)

{
  Arena *pAVar1;
  
  RepeatedField(this,arena);
  pAVar1 = GetArena(rhs);
  if (pAVar1 == arena) {
    InternalSwap(this,rhs);
  }
  else {
    CopyFrom(this,rhs);
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(Arena* arena, RepeatedField&& rhs)
    : RepeatedField(arena) {
  if (internal::CanMoveWithInternalSwap(arena, rhs.GetArena())) {
    InternalSwap(&rhs);
  } else {
    // We don't just call Swap(&rhs) here because it would perform 3 copies if
    // rhs is on a different arena.
    CopyFrom(rhs);
  }
}